

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O2

int qpdfjob_run(qpdfjob_handle j)

{
  int iVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  QUtil::setLineBuf(_stdout);
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<int_(_qpdfjob_handle_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:92:28)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<int_(_qpdfjob_handle_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdfjob-c.cc:92:28)>
             ::_M_manager;
  iVar1 = wrap_qpdfjob(j,(function<int_(_qpdfjob_handle_*)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return iVar1;
}

Assistant:

int
qpdfjob_run(qpdfjob_handle j)
{
    QUtil::setLineBuf(stdout);
    return wrap_qpdfjob(j, [](qpdfjob_handle jh) {
        jh->j.run();
        return jh->j.getExitCode();
    });
}